

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi_uc sVar1;
  ushort uVar2;
  undefined2 uVar3;
  double dVar4;
  float fVar5;
  undefined8 uVar6;
  stbi_uc sVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  stbi__context *data;
  stbi_uc *psVar11;
  float *__ptr;
  void *pvVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int *piVar16;
  long lVar17;
  ulong uVar18;
  ushort *puVar19;
  long lVar20;
  ulong uVar21;
  undefined4 in_register_00000084;
  stbi_uc *psVar22;
  ushort *puVar23;
  stbi__result_info *ri_00;
  ulong uVar24;
  float *pfVar25;
  uint uVar26;
  void *pvVar27;
  ulong uVar28;
  long in_FS_OFFSET;
  float fVar29;
  stbi__gif local_88a0;
  
  psVar22 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  lVar20 = 0;
  ri_00 = ri;
  do {
    sVar7 = stbi__get8(s);
    sVar1 = (&stbi__check_png_header_png_sig)[lVar20];
    if (sVar7 != sVar1) {
      *(char **)(in_FS_OFFSET + -0x10) = "bad png sig";
      break;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 8);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar7 == sVar1) {
    if ((uint)req_comp < 5) {
      psVar11 = (uchar *)0x0;
      local_88a0._0_8_ = s;
      iVar8 = stbi__parse_png_file((stbi__png *)&local_88a0,0,req_comp);
      psVar22 = local_88a0.history;
      uVar6 = local_88a0._0_8_;
      if (iVar8 != 0) {
        iVar8 = 8;
        if ((8 < local_88a0.flags) && (iVar8 = 0x10, local_88a0.flags != 0x10)) {
          pcVar10 = "bad bits_per_channel";
          goto LAB_00145b30;
        }
        ri->bits_per_channel = iVar8;
        local_88a0.history = (uchar *)0x0;
        psVar11 = psVar22;
        if ((req_comp != 0) && (iVar8 = *(int *)(local_88a0._0_8_ + 0xc), iVar8 != req_comp)) {
          uVar26 = *(stbi__uint32 *)local_88a0._0_8_;
          uVar15 = *(stbi__uint32 *)(local_88a0._0_8_ + 4);
          if (local_88a0.flags < 9) {
            psVar11 = stbi__convert_format(psVar22,iVar8,req_comp,uVar26,uVar15);
          }
          else {
            psVar11 = (stbi_uc *)malloc((ulong)(req_comp * uVar26 * uVar15 * 2));
            if (psVar11 == (uchar *)0x0) {
              free(psVar22);
              *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
              psVar11 = (uchar *)0x0;
            }
            else {
              if (0 < (int)uVar15) {
                uVar9 = req_comp + iVar8 * 8;
                if ((0x23 < uVar9) || ((0xe161a1c00U >> ((ulong)uVar9 & 0x3f) & 1) == 0)) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                                ,0x6fa,
                                "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                               );
                }
                iVar13 = uVar26 - 1;
                uVar18 = 1;
                if (1 < (int)uVar15) {
                  uVar18 = (ulong)uVar15;
                }
                uVar21 = 0;
                uVar24 = 0;
                uVar28 = 0;
                do {
                  iVar14 = uVar26 * (int)uVar28;
                  puVar23 = (ushort *)(psVar22 + (ulong)(uint)(iVar14 * iVar8) * 2);
                  puVar19 = (ushort *)(psVar11 + (ulong)(uint)(iVar14 * req_comp) * 2);
                  if (uVar9 - 10 < 0x19) {
                    lVar20 = uVar24 * 2;
                    switch(uVar9) {
                    case 10:
                      if (-1 < iVar13) {
                        lVar20 = 0;
                        uVar15 = uVar26;
                        do {
                          *(undefined2 *)(psVar11 + lVar20 * 2 + uVar24 * 2) =
                               *(undefined2 *)(psVar22 + lVar20 + uVar21 * 2);
                          (psVar11 + lVar20 * 2 + uVar24 * 2 + 2)[0] = 0xff;
                          (psVar11 + lVar20 * 2 + uVar24 * 2 + 2)[1] = 0xff;
                          uVar15 = uVar15 - 1;
                          lVar20 = lVar20 + 2;
                        } while (0 < (int)uVar15);
                      }
                      break;
                    case 0xb:
                      if (-1 < iVar13) {
                        puVar19 = (ushort *)(psVar11 + uVar24 * 2 + 4);
                        uVar15 = uVar26;
                        do {
                          uVar2 = *puVar23;
                          *puVar19 = uVar2;
                          puVar19[-1] = uVar2;
                          puVar19[-2] = uVar2;
                          puVar23 = puVar23 + 1;
                          uVar15 = uVar15 - 1;
                          puVar19 = puVar19 + 3;
                        } while (0 < (int)uVar15);
                      }
                      break;
                    case 0xc:
                      if (-1 < iVar13) {
                        lVar17 = 0;
                        uVar15 = uVar26;
                        do {
                          uVar3 = *(undefined2 *)(psVar22 + lVar17 + uVar21 * 2);
                          *(undefined2 *)(psVar11 + lVar17 * 4 + lVar20 + 4) = uVar3;
                          *(undefined2 *)(psVar11 + lVar17 * 4 + lVar20 + 2) = uVar3;
                          *(undefined2 *)(psVar11 + lVar17 * 4 + lVar20) = uVar3;
                          (psVar11 + lVar17 * 4 + lVar20 + 6)[0] = 0xff;
                          (psVar11 + lVar17 * 4 + lVar20 + 6)[1] = 0xff;
                          uVar15 = uVar15 - 1;
                          lVar17 = lVar17 + 2;
                        } while (0 < (int)uVar15);
                      }
                      break;
                    default:
                      goto switchD_00145c43_caseD_d;
                    case 0x11:
                      if (-1 < iVar13) {
                        lVar20 = 0;
                        uVar15 = uVar26;
                        do {
                          *(undefined2 *)(psVar11 + lVar20 + uVar24 * 2) =
                               *(undefined2 *)(psVar22 + lVar20 * 2 + uVar21 * 2);
                          uVar15 = uVar15 - 1;
                          lVar20 = lVar20 + 2;
                        } while (0 < (int)uVar15);
                      }
                      break;
                    case 0x13:
                      if (-1 < iVar13) {
                        puVar19 = (ushort *)(psVar11 + uVar24 * 2 + 4);
                        uVar15 = uVar26;
                        do {
                          uVar2 = *puVar23;
                          *puVar19 = uVar2;
                          puVar19[-1] = uVar2;
                          puVar19[-2] = uVar2;
                          puVar23 = puVar23 + 2;
                          uVar15 = uVar15 - 1;
                          puVar19 = puVar19 + 3;
                        } while (0 < (int)uVar15);
                      }
                      break;
                    case 0x14:
                      if (-1 < iVar13) {
                        lVar17 = 0;
                        uVar15 = uVar26;
                        do {
                          uVar3 = *(undefined2 *)(psVar22 + lVar17 + uVar21 * 2);
                          *(undefined2 *)(psVar11 + lVar17 * 2 + lVar20 + 4) = uVar3;
                          *(undefined2 *)(psVar11 + lVar17 * 2 + lVar20 + 2) = uVar3;
                          *(undefined2 *)(psVar11 + lVar17 * 2 + lVar20) = uVar3;
                          *(undefined2 *)(psVar11 + lVar17 * 2 + lVar20 + 6) =
                               *(undefined2 *)(psVar22 + lVar17 + uVar21 * 2 + 2);
                          uVar15 = uVar15 - 1;
                          lVar17 = lVar17 + 4;
                        } while (0 < (int)uVar15);
                      }
                      break;
                    case 0x19:
                      uVar15 = uVar26;
                      if (-1 < iVar13) {
                        do {
                          uVar2 = puVar23[2];
                          *puVar19 = (ushort)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3
                                              + (uint)puVar23[1] * 0x96 + (uint)*puVar23 * 0x4d >> 8
                                             );
                          puVar23 = puVar23 + 3;
                          puVar19 = puVar19 + 1;
                          uVar15 = uVar15 - 1;
                        } while (0 < (int)uVar15);
                      }
                      break;
                    case 0x1a:
                      uVar15 = uVar26;
                      if (-1 < iVar13) {
                        do {
                          uVar2 = puVar23[2];
                          *puVar19 = (ushort)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3
                                              + (uint)puVar23[1] * 0x96 + (uint)*puVar23 * 0x4d >> 8
                                             );
                          puVar19[1] = 0xffff;
                          puVar23 = puVar23 + 3;
                          puVar19 = puVar19 + 2;
                          uVar15 = uVar15 - 1;
                        } while (0 < (int)uVar15);
                      }
                      break;
                    case 0x1c:
                      uVar15 = uVar26;
                      if (-1 < iVar13) {
                        do {
                          *puVar19 = *puVar23;
                          puVar19[1] = puVar23[1];
                          puVar19[2] = puVar23[2];
                          puVar19[3] = 0xffff;
                          puVar23 = puVar23 + 3;
                          puVar19 = puVar19 + 4;
                          uVar15 = uVar15 - 1;
                        } while (0 < (int)uVar15);
                      }
                      break;
                    case 0x21:
                      if (-1 < iVar13) {
                        lVar20 = 0;
                        uVar15 = uVar26;
                        do {
                          uVar2 = *(ushort *)(psVar22 + lVar20 * 4 + uVar21 * 2 + 4);
                          *(short *)(psVar11 + lVar20 + uVar24 * 2) =
                               (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                                       (uint)*(ushort *)(psVar22 + lVar20 * 4 + uVar21 * 2 + 2) *
                                       0x96 + (uint)*(ushort *)(psVar22 + lVar20 * 4 + uVar21 * 2) *
                                              0x4d >> 8);
                          uVar15 = uVar15 - 1;
                          lVar20 = lVar20 + 2;
                        } while (0 < (int)uVar15);
                      }
                      break;
                    case 0x22:
                      if (-1 < iVar13) {
                        lVar20 = 0;
                        uVar15 = uVar26;
                        do {
                          uVar2 = *(ushort *)(psVar22 + lVar20 * 2 + uVar21 * 2 + 4);
                          *(short *)(psVar11 + lVar20 + uVar24 * 2) =
                               (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                                       (uint)*(ushort *)(psVar22 + lVar20 * 2 + uVar21 * 2 + 2) *
                                       0x96 + (uint)*(ushort *)(psVar22 + lVar20 * 2 + uVar21 * 2) *
                                              0x4d >> 8);
                          *(undefined2 *)(psVar11 + lVar20 + uVar24 * 2 + 2) =
                               *(undefined2 *)(psVar22 + lVar20 * 2 + uVar21 * 2 + 6);
                          uVar15 = uVar15 - 1;
                          lVar20 = lVar20 + 4;
                        } while (0 < (int)uVar15);
                      }
                    }
                  }
                  else {
switchD_00145c43_caseD_d:
                    uVar15 = uVar26;
                    if (-1 < iVar13) {
                      do {
                        *puVar19 = *puVar23;
                        puVar19[1] = puVar23[1];
                        puVar19[2] = puVar23[2];
                        puVar23 = puVar23 + 4;
                        puVar19 = puVar19 + 3;
                        uVar15 = uVar15 - 1;
                      } while (0 < (int)uVar15);
                    }
                  }
                  uVar28 = uVar28 + 1;
                  uVar24 = (ulong)((int)uVar24 + req_comp * uVar26);
                  uVar21 = (ulong)((int)uVar21 + iVar8 * uVar26);
                } while (uVar28 != uVar18);
              }
              free(psVar22);
            }
          }
          *(int *)(uVar6 + 0xc) = req_comp;
          if (psVar11 == (uchar *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)local_88a0._0_8_;
        *y = *(stbi__uint32 *)(local_88a0._0_8_ + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(local_88a0._0_8_ + 8);
        }
      }
      free(local_88a0.history);
      local_88a0.history = (stbi_uc *)0x0;
      free(local_88a0.background);
      local_88a0.background = (stbi_uc *)0x0;
      free(local_88a0.out);
      return psVar11;
    }
    pcVar10 = "bad req_comp";
  }
  else {
    iVar8 = stbi__gif_test(s);
    if (iVar8 != 0) {
      memset(&local_88a0,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a0,comp,0,psVar22);
      if (data == s) {
        data = (stbi__context *)0x0;
      }
      if (data == (stbi__context *)0x0) {
        if (local_88a0.out != (stbi_uc *)0x0) {
          free(local_88a0.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a0.w;
        *y = local_88a0.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a0.w,local_88a0.h);
        }
      }
      free(local_88a0.history);
      free(local_88a0.background);
      return data;
    }
    iVar8 = stbi__hdr_test(s);
    if (iVar8 == 0) {
      pcVar10 = "unknown image type";
    }
    else {
      piVar16 = comp;
      __ptr = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      if (__ptr == (float *)0x0) {
        return (void *)0x0;
      }
      iVar8 = *x;
      iVar13 = *y;
      pvVar12 = stbi__malloc_mad3(iVar8,iVar13,req_comp,(int)piVar16);
      if (pvVar12 != (void *)0x0) {
        uVar26 = iVar13 * iVar8;
        if (0 < (int)uVar26) {
          uVar15 = (req_comp + (req_comp & 1U)) - 1;
          lVar20 = (long)req_comp;
          uVar18 = 0;
          pfVar25 = __ptr;
          pvVar27 = pvVar12;
          do {
            uVar21 = 0;
            if (0 < (int)uVar15) {
              uVar21 = 0;
              do {
                dVar4 = pow((double)(pfVar25[uVar21] * stbi__h2l_scale_i),(double)stbi__h2l_gamma_i)
                ;
                fVar29 = (float)dVar4 * 255.0 + 0.5;
                fVar5 = 0.0;
                if (0.0 <= fVar29) {
                  fVar5 = fVar29;
                }
                fVar29 = 255.0;
                if (fVar5 <= 255.0) {
                  fVar29 = fVar5;
                }
                *(char *)((long)pvVar27 + uVar21) = (char)(int)fVar29;
                uVar21 = uVar21 + 1;
              } while (uVar15 != uVar21);
            }
            if ((int)uVar21 < req_comp) {
              lVar17 = (long)(int)uVar21 + uVar18 * lVar20;
              fVar29 = __ptr[lVar17] * 255.0 + 0.5;
              fVar5 = 0.0;
              if (0.0 <= fVar29) {
                fVar5 = fVar29;
              }
              fVar29 = 255.0;
              if (fVar5 <= 255.0) {
                fVar29 = fVar5;
              }
              *(char *)((long)pvVar12 + lVar17) = (char)(int)fVar29;
            }
            uVar18 = uVar18 + 1;
            pvVar27 = (void *)((long)pvVar27 + lVar20);
            pfVar25 = pfVar25 + lVar20;
          } while (uVar18 != uVar26);
        }
        free(__ptr);
        return pvVar12;
      }
      free(__ptr);
      pcVar10 = "outofmem";
    }
  }
LAB_00145b30:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar10;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}